

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# number_skeletons.cpp
# Opt level: O0

bool icu_63::number::impl::blueprint_helpers::parseExponentWidthOption
               (StringSegment *segment,MacroProps *macros,UErrorCode *param_3)

{
  char16_t cVar1;
  int32_t iVar2;
  ScientificNotation SVar3;
  undefined8 local_50;
  UNumberSignDisplay local_48;
  int local_30;
  int local_2c;
  int32_t minExp;
  int32_t offset;
  UErrorCode *param_2_local;
  MacroProps *macros_local;
  StringSegment *segment_local;
  
  cVar1 = numparse::impl::StringSegment::charAt(segment,0);
  if (cVar1 == L'+') {
    local_2c = 1;
    local_30 = 0;
    while ((iVar2 = numparse::impl::StringSegment::length(segment), local_2c < iVar2 &&
           (cVar1 = numparse::impl::StringSegment::charAt(segment,local_2c), cVar1 == L'e'))) {
      local_30 = local_30 + 1;
      local_2c = local_2c + 1;
    }
    iVar2 = numparse::impl::StringSegment::length(segment);
    if (local_2c < iVar2) {
      segment_local._7_1_ = false;
    }
    else {
      SVar3 = ScientificNotation::withMinExponentDigits
                        ((ScientificNotation *)&macros->notation,local_30);
      local_50 = SVar3.super_Notation._0_8_;
      local_48 = SVar3.super_Notation.fUnion._4_4_;
      *(undefined8 *)&macros->notation = local_50;
      (macros->notation).fUnion.scientific.fExponentSignDisplay = local_48;
      segment_local._7_1_ = true;
    }
  }
  else {
    segment_local._7_1_ = false;
  }
  return segment_local._7_1_;
}

Assistant:

bool blueprint_helpers::parseExponentWidthOption(const StringSegment& segment, MacroProps& macros,
                                                 UErrorCode&) {
    if (segment.charAt(0) != u'+') {
        return false;
    }
    int32_t offset = 1;
    int32_t minExp = 0;
    for (; offset < segment.length(); offset++) {
        if (segment.charAt(offset) == u'e') {
            minExp++;
        } else {
            break;
        }
    }
    if (offset < segment.length()) {
        return false;
    }
    // Use the public APIs to enforce bounds checking
    macros.notation = static_cast<ScientificNotation&>(macros.notation).withMinExponentDigits(minExp);
    return true;
}